

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

void __thiscall cfd::core::HashUtil::HashUtil(HashUtil *this,string *hash_type)

{
  SupportHashFormat (*paSVar1) [6];
  __type _Var2;
  ulong uVar3;
  undefined8 uVar4;
  SupportHashFormat (*paSVar5) [6];
  string *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  CfdError CVar6;
  CfdException *in_stack_ffffffffffffff10;
  allocator local_b9;
  string local_b8 [32];
  SupportHashFormat *local_98;
  SupportHashFormat *item;
  SupportHashFormat *__end2;
  SupportHashFormat *__begin2;
  SupportHashFormat (*__range2) [6];
  size_t index;
  string name;
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *hash_type_local;
  HashUtil *this_local;
  
  this->_vptr_HashUtil = (_func_int **)&PTR__HashUtil_00b635d0;
  local_18 = hash_type;
  hash_type_local = (string *)this;
  ByteData::ByteData(&this->buffer_);
  uVar3 = ::std::__cxx11::string::length();
  if (0x14 < uVar3) {
    uVar4 = __cxa_allocate_exception(0x30);
    CVar6 = (CfdError)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"unsupported hash type.",&local_39);
    CfdException::CfdException(in_stack_ffffffffffffff10,CVar6,in_stack_ffffffffffffff00);
    __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::__cxx11::string::string((string *)&index,(string *)local_18);
  for (__range2 = (SupportHashFormat (*) [6])0x0; paSVar1 = __range2,
      paSVar5 = (SupportHashFormat (*) [6])::std::__cxx11::string::length(), paSVar1 < paSVar5;
      __range2 = (SupportHashFormat (*) [6])&(*__range2)[0].field_0x1) {
    in_stack_ffffffffffffff10 = (CfdException *)::std::__cxx11::string::operator[]((ulong)&index);
    if (('@' < (char)in_stack_ffffffffffffff10->super_exception) &&
       (in_stack_ffffffffffffff08 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ::std::__cxx11::string::operator[]((ulong)&index),
       (char)in_stack_ffffffffffffff08->_M_dataplus < '[')) {
      in_stack_ffffffffffffff00 = (string *)::std::__cxx11::string::operator[]((ulong)&index);
      in_stack_ffffffffffffff00->_M_dataplus =
           (_Alloc_hider)((char)in_stack_ffffffffffffff00->_M_dataplus + ' ');
    }
  }
  __begin2 = (SupportHashFormat *)kFormatList;
  item = (SupportHashFormat *)kBase64EncodeTable_abi_cxx11_;
  for (__end2 = (SupportHashFormat *)kFormatList;
      (__end2 != item && (local_98 = __end2, __end2->type != '\0')); __end2 = __end2 + 1) {
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    if (_Var2) {
      this->hash_type_ = local_98->type;
      ::std::__cxx11::string::~string((string *)&index);
      return;
    }
  }
  uVar4 = __cxa_allocate_exception(0x30);
  CVar6 = (CfdError)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_b8,"unsupported hash type.",&local_b9);
  CfdException::CfdException(in_stack_ffffffffffffff10,CVar6,in_stack_ffffffffffffff00);
  __cxa_throw(uVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

HashUtil::HashUtil(const std::string &hash_type) {
  if (hash_type.length() > 20)
    throw CfdException(kCfdIllegalArgumentError, "unsupported hash type.");

  std::string name = hash_type;
  for (size_t index = 0; index < name.length(); ++index) {
    if ((name[index] >= 'A') && (name[index] <= 'Z')) {
      name[index] += 'a' - 'A';
    }
  }
  for (const auto &item : kFormatList) {
    if (item.type == 0) break;
    if (name == item.name) {
      hash_type_ = item.type;
      return;
    }
  }
  throw CfdException(kCfdIllegalArgumentError, "unsupported hash type.");
}